

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

int mod2dense_flip(mod2dense *m,int row,int col)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int b;
  mod2word *w;
  uint local_20;
  
  if ((((-1 < in_ESI) && (in_ESI < *in_RDI)) && (-1 < in_EDX)) && (in_EDX < in_RDI[1])) {
    bVar1 = (byte)in_ESI;
    uVar2 = *(uint *)(*(long *)(*(long *)(in_RDI + 4) + (long)in_EDX * 8) + (long)(in_ESI >> 5) * 4)
            >> (bVar1 & 0x1f) & 1 ^ 1;
    puVar3 = (uint *)(*(long *)(*(long *)(in_RDI + 4) + (long)in_EDX * 8) + (long)(in_ESI >> 5) * 4)
    ;
    if (uVar2 == 0) {
      local_20 = *puVar3 & (1 << (bVar1 & 0x1f) ^ 0xffffffffU);
    }
    else {
      local_20 = *puVar3 | 1 << (bVar1 & 0x1f);
    }
    *puVar3 = local_20;
    return uVar2;
  }
  fprintf(_stderr,"mod2dense_flip: row or column index out of bounds\n");
  exit(1);
}

Assistant:

int mod2dense_flip  
( mod2dense *m, 	/* Matrix to flip element in */
  int row,		/* Row of element (starting with zero) */
  int col		/* Column of element (starting with zero) */
)
{
  mod2word *w;
  int b;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_flip: row or column index out of bounds\n");
    exit(1);
  }

  b = 1 ^ mod2_getbit (m->col[col][row>>mod2_wordsize_shift], 
                       row&mod2_wordsize_mask);

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = b ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
         : mod2_setbit0(*w,row&mod2_wordsize_mask);

  return b;
}